

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::ZNames::ZNamesLoader::put
          (ZNamesLoader *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  UTimeZoneNameTypeIndex UVar3;
  undefined7 in_register_00000009;
  int i;
  ResourceTable namesTable;
  char *local_60;
  ResourceTable local_58;
  
  local_60 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = ResourceTable::getKeyAndValue(&local_58,0,&local_60,value);
    if (UVar1 != '\0') {
      i = 1;
      do {
        iVar2 = (*(value->super_UObject)._vptr_UObject[0xc])(value);
        if ((char)iVar2 == '\0') {
          setNameIfEmpty(this,local_60,value,errorCode);
        }
        else {
          UVar3 = nameTypeFromKey(local_60);
          if ((UVar3 != UTZNM_INDEX_UNKNOWN) && (this->names[UVar3] == (UChar *)0x0)) {
            this->names[UVar3] = L"";
          }
        }
        UVar1 = ResourceTable::getKeyAndValue(&local_58,i,&local_60,value);
        i = i + 1;
      } while (UVar1 != '\0');
    }
  }
  return;
}

Assistant:

virtual void put(const char* key, ResourceValue& value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable namesTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; namesTable.getKeyAndValue(i, key, value); ++i) {
            if (value.isNoInheritanceMarker()) {
                setNameIfEmpty(key, NULL, errorCode);
            } else {
                setNameIfEmpty(key, &value, errorCode);
            }
        }
    }